

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRRShared.cpp
# Opt level: O2

void __thiscall Assimp::IrrlichtBase::ReadBoolProperty(IrrlichtBase *this,BoolProperty *out)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  int i;
  uint uVar2;
  allocator local_51;
  string local_50 [32];
  
  uVar2 = 0;
  while( true ) {
    iVar1 = (*this->reader->_vptr_IIrrXMLReader[4])();
    if (iVar1 <= (int)uVar2) break;
    iVar1 = (*this->reader->_vptr_IIrrXMLReader[5])(this->reader,(ulong)uVar2);
    iVar1 = ASSIMP_stricmp((char *)CONCAT44(extraout_var,iVar1),"name");
    if (iVar1 == 0) {
      iVar1 = (*this->reader->_vptr_IIrrXMLReader[6])(this->reader,(ulong)uVar2);
      std::__cxx11::string::string(local_50,(char *)CONCAT44(extraout_var_02,iVar1),&local_51);
      std::__cxx11::string::operator=((string *)out,local_50);
      std::__cxx11::string::~string(local_50);
    }
    else {
      iVar1 = (*this->reader->_vptr_IIrrXMLReader[5])(this->reader,(ulong)uVar2);
      iVar1 = ASSIMP_stricmp((char *)CONCAT44(extraout_var_00,iVar1),"value");
      if (iVar1 == 0) {
        iVar1 = (*this->reader->_vptr_IIrrXMLReader[6])(this->reader,(ulong)uVar2);
        iVar1 = ASSIMP_stricmp((char *)CONCAT44(extraout_var_01,iVar1),"true");
        out->value = iVar1 == 0;
      }
    }
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

void IrrlichtBase::ReadBoolProperty   (BoolProperty&   out)
{
    for (int i = 0; i < reader->getAttributeCount();++i)
    {
        if (!ASSIMP_stricmp(reader->getAttributeName(i),"name"))
        {
            out.name = std::string( reader->getAttributeValue(i) );
        }
        else if (!ASSIMP_stricmp(reader->getAttributeName(i),"value"))
        {
            // true or false, case insensitive
            out.value = (ASSIMP_stricmp( reader->getAttributeValue(i),
                "true") ? false : true);
        }
    }
}